

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolarDecomposition.cpp
# Opt level: O3

uint __thiscall
btPolarDecomposition::decompose
          (btPolarDecomposition *this,btMatrix3x3 *a,btMatrix3x3 *u,btMatrix3x3 *h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  float fVar8;
  btScalar bVar9;
  btScalar bVar10;
  btScalar bVar11;
  btScalar bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  
  uVar1 = *(undefined8 *)(a->m_el[0].m_floats + 2);
  *(undefined8 *)u->m_el[0].m_floats = *(undefined8 *)a->m_el[0].m_floats;
  *(undefined8 *)(u->m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)(a->m_el[1].m_floats + 2);
  *(undefined8 *)u->m_el[1].m_floats = *(undefined8 *)a->m_el[1].m_floats;
  *(undefined8 *)(u->m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)(a->m_el[2].m_floats + 2);
  *(undefined8 *)u->m_el[2].m_floats = *(undefined8 *)a->m_el[2].m_floats;
  *(undefined8 *)(u->m_el[2].m_floats + 2) = uVar1;
  fVar25 = a->m_el[1].m_floats[1];
  fVar23 = a->m_el[1].m_floats[2];
  fVar13 = a->m_el[0].m_floats[0];
  fVar26 = a->m_el[0].m_floats[1];
  fVar28 = a->m_el[0].m_floats[2];
  uVar1 = *(undefined8 *)(a->m_el[2].m_floats + 1);
  fVar16 = (float)uVar1;
  fVar17 = (float)((ulong)uVar1 >> 0x20);
  fVar22 = a->m_el[2].m_floats[0];
  fVar15 = a->m_el[1].m_floats[0];
  fVar8 = fVar25 * fVar17 - fVar23 * fVar16;
  uVar1 = *(undefined8 *)a->m_el[2].m_floats;
  h->m_el[0].m_floats[3] = 0.0;
  fVar24 = fVar22 * fVar23 - fVar17 * fVar15;
  h->m_el[1].m_floats[3] = 0.0;
  fVar31 = fVar16 * fVar15 - fVar25 * (float)uVar1;
  fVar14 = 1.0 / (fVar28 * fVar31 + fVar13 * fVar8 + fVar26 * fVar24);
  *(ulong *)h->m_el[0].m_floats =
       CONCAT44((fVar28 * fVar16 - fVar26 * fVar17) * fVar14,fVar8 * fVar14);
  h->m_el[0].m_floats[2] = (fVar26 * fVar23 + -fVar28 * fVar25) * fVar14;
  *(ulong *)h->m_el[1].m_floats =
       CONCAT44((fVar17 * fVar13 - fVar22 * fVar28) * fVar14,fVar24 * fVar14);
  h->m_el[1].m_floats[2] = (fVar28 * fVar15 + -fVar13 * fVar23) * fVar14;
  *(ulong *)h->m_el[2].m_floats =
       CONCAT44(fVar14 * (fVar22 * fVar26 - fVar13 * (float)((ulong)uVar1 >> 0x20)),fVar14 * fVar31)
  ;
  h->m_el[2].m_floats[2] = fVar14 * (fVar13 * fVar25 + -fVar26 * fVar15);
  h->m_el[2].m_floats[3] = 0.0;
  if (this->m_maxIterations != 0) {
    uVar7 = 0;
    do {
      bVar9 = anon_unknown.dwarf_6d96c::p1_norm(h);
      bVar10 = anon_unknown.dwarf_6d96c::pinf_norm(h);
      bVar11 = anon_unknown.dwarf_6d96c::p1_norm(u);
      bVar12 = anon_unknown.dwarf_6d96c::pinf_norm(u);
      if ((ABS(bVar10 * bVar9) < 1.1920929e-07) || (ABS(bVar12 * bVar11) < 1.1920929e-07)) break;
      fVar8 = powf((bVar10 * bVar9) / (bVar12 * bVar11),0.25);
      fVar21 = 1.0 / fVar8;
      fVar8 = fVar8 + -2.0;
      fVar25 = u->m_el[1].m_floats[2];
      fVar22 = h->m_el[0].m_floats[1];
      fVar15 = h->m_el[0].m_floats[2];
      fVar24 = (h->m_el[2].m_floats[1] * fVar21 + fVar8 * fVar25) * 0.5;
      fVar25 = fVar25 + fVar24;
      uVar1 = *(undefined8 *)u->m_el[0].m_floats;
      fVar32 = (float)uVar1;
      fVar33 = (float)((ulong)uVar1 >> 0x20);
      fVar19 = (h->m_el[0].m_floats[0] * fVar21 + fVar32 * fVar8) * 0.5;
      fVar20 = (h->m_el[1].m_floats[0] * fVar21 + fVar33 * fVar8) * 0.5;
      fVar32 = fVar32 + fVar19;
      fVar33 = fVar33 + fVar20;
      fVar23 = h->m_el[1].m_floats[1];
      fVar13 = h->m_el[1].m_floats[2];
      fVar26 = h->m_el[2].m_floats[2];
      fVar28 = h->m_el[2].m_floats[0];
      *(ulong *)u->m_el[0].m_floats = CONCAT44(fVar33,fVar32);
      u->m_el[0].m_floats[3] = 0.0;
      uVar1 = *(undefined8 *)u->m_el[1].m_floats;
      fVar29 = (float)uVar1;
      fVar30 = (float)((ulong)uVar1 >> 0x20);
      fVar31 = (fVar22 * fVar21 + fVar8 * fVar29) * 0.5;
      fVar18 = (fVar23 * fVar21 + fVar8 * fVar30) * 0.5;
      fVar29 = fVar29 + fVar31;
      fVar30 = fVar30 + fVar18;
      *(ulong *)u->m_el[1].m_floats = CONCAT44(fVar30,fVar29);
      u->m_el[1].m_floats[2] = fVar25;
      u->m_el[1].m_floats[3] = 0.0;
      fVar23 = u->m_el[0].m_floats[2];
      fVar22 = u->m_el[2].m_floats[2];
      uVar1 = *(undefined8 *)u->m_el[2].m_floats;
      fVar16 = (float)uVar1;
      fVar17 = (float)((ulong)uVar1 >> 0x20);
      fVar15 = (fVar15 * fVar21 + fVar8 * fVar16) * 0.5;
      fVar14 = (fVar13 * fVar21 + fVar8 * fVar17) * 0.5;
      fVar16 = fVar16 + fVar15;
      fVar17 = fVar17 + fVar14;
      fVar27 = (fVar26 * fVar21 + fVar8 * fVar22) * 0.5;
      fVar28 = (fVar28 * fVar21 + fVar8 * fVar23) * 0.5;
      fVar22 = fVar22 + fVar27;
      fVar23 = fVar23 + fVar28;
      fVar26 = fVar25 * fVar16 - fVar22 * fVar29;
      *(ulong *)u->m_el[2].m_floats = CONCAT44(fVar17,fVar16);
      fVar21 = fVar30 * fVar22 - fVar17 * fVar25;
      u->m_el[2].m_floats[3] = 0.0;
      u->m_el[0].m_floats[2] = fVar23;
      u->m_el[2].m_floats[2] = fVar22;
      fVar8 = fVar29 * fVar17 + -fVar30 * fVar16;
      h->m_el[0].m_floats[3] = 0.0;
      h->m_el[1].m_floats[3] = 0.0;
      fVar13 = 1.0 / (fVar23 * fVar8 + fVar32 * fVar21 + fVar33 * fVar26);
      *(ulong *)h->m_el[0].m_floats =
           CONCAT44((fVar17 * fVar23 - fVar22 * fVar33) * fVar13,fVar21 * fVar13);
      h->m_el[1].m_floats[0] = fVar26 * fVar13;
      h->m_el[0].m_floats[2] = fVar13 * (fVar33 * fVar25 + fVar30 * -fVar23);
      *(ulong *)(h->m_el[1].m_floats + 1) =
           CONCAT44((fVar29 * fVar23 - fVar25 * fVar32) * fVar13,
                    (fVar32 * fVar22 - fVar16 * fVar23) * fVar13);
      *(ulong *)h->m_el[2].m_floats =
           CONCAT44(fVar13 * (fVar33 * fVar16 + -fVar32 * fVar17),fVar13 * fVar8);
      h->m_el[2].m_floats[2] = (fVar32 * fVar30 + -fVar33 * fVar29) * fVar13;
      fVar25 = ABS(fVar15) + ABS(fVar31) + ABS(fVar19);
      fVar23 = ABS(fVar14) + ABS(fVar18) + ABS(fVar20);
      fVar13 = ABS(fVar27) + ABS(fVar24) + ABS(fVar28);
      if (fVar25 <= fVar23) {
        fVar25 = fVar23;
      }
      if (fVar25 <= fVar13) {
        fVar25 = fVar13;
      }
      h->m_el[2].m_floats[3] = 0.0;
      if (fVar25 <= bVar11 * this->m_tolerance) {
        fVar25 = u->m_el[0].m_floats[2];
        fVar23 = u->m_el[1].m_floats[2];
        fVar13 = u->m_el[2].m_floats[2];
        fVar26 = a->m_el[0].m_floats[2];
        fVar28 = a->m_el[1].m_floats[2];
        fVar22 = a->m_el[2].m_floats[2];
        fVar8 = fVar22 * fVar13 + fVar26 * fVar25 + fVar23 * fVar28;
        uVar1 = *(undefined8 *)u->m_el[0].m_floats;
        uVar2 = *(undefined8 *)u->m_el[1].m_floats;
        uVar3 = *(undefined8 *)u->m_el[2].m_floats;
        fVar17 = (float)uVar3;
        fVar24 = (float)((ulong)uVar3 >> 0x20);
        uVar3 = *(undefined8 *)a->m_el[0].m_floats;
        uVar4 = *(undefined8 *)a->m_el[1].m_floats;
        uVar5 = *(undefined8 *)a->m_el[2].m_floats;
        fVar29 = (float)uVar4;
        fVar30 = (float)((ulong)uVar4 >> 0x20);
        fVar21 = (float)uVar3;
        fVar27 = (float)((ulong)uVar3 >> 0x20);
        fVar15 = (float)uVar5;
        fVar16 = (float)((ulong)uVar5 >> 0x20);
        fVar19 = (float)uVar2;
        fVar31 = (float)uVar1;
        fVar18 = (float)((ulong)uVar1 >> 0x20);
        fVar20 = (float)((ulong)uVar2 >> 0x20);
        fVar14 = fVar15 * fVar17 + fVar21 * fVar31 + fVar29 * fVar19;
        fVar32 = fVar24 * fVar16 + fVar18 * fVar27 + fVar20 * fVar30;
        fVar33 = (fVar16 * fVar17 + fVar27 * fVar31 + fVar30 * fVar19 +
                 fVar15 * fVar24 + fVar21 * fVar18 + fVar29 * fVar20) * 0.5;
        fVar15 = (fVar22 * fVar17 + fVar26 * fVar31 + fVar28 * fVar19 +
                 fVar13 * fVar15 + fVar25 * fVar21 + fVar23 * fVar29) * 0.5;
        fVar25 = (fVar22 * fVar24 + fVar26 * fVar18 + fVar28 * fVar20 +
                 fVar13 * fVar16 + fVar25 * fVar27 + fVar23 * fVar30) * 0.5;
        *(ulong *)h->m_el[0].m_floats = CONCAT44(fVar33,(fVar14 + fVar14) * 0.5);
        h->m_el[0].m_floats[2] = fVar15;
        h->m_el[0].m_floats[3] = 0.0;
        h->m_el[1].m_floats[0] = fVar33;
        h->m_el[1].m_floats[1] = (fVar32 + fVar32) * 0.5;
        h->m_el[1].m_floats[2] = fVar25;
        h->m_el[1].m_floats[3] = 0.0;
        *(ulong *)h->m_el[2].m_floats = CONCAT44(fVar25,fVar15);
        h->m_el[2].m_floats[2] = (fVar8 + fVar8) * 0.5;
        h->m_el[2].m_floats[3] = 0.0;
        return uVar7;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < this->m_maxIterations);
  }
  fVar25 = u->m_el[0].m_floats[2];
  fVar23 = u->m_el[1].m_floats[2];
  fVar13 = u->m_el[2].m_floats[2];
  fVar26 = a->m_el[0].m_floats[2];
  fVar28 = a->m_el[1].m_floats[2];
  fVar22 = a->m_el[2].m_floats[2];
  fVar8 = fVar22 * fVar13 + fVar26 * fVar25 + fVar23 * fVar28;
  uVar1 = *(undefined8 *)u->m_el[0].m_floats;
  uVar2 = *(undefined8 *)u->m_el[1].m_floats;
  uVar3 = *(undefined8 *)u->m_el[2].m_floats;
  uVar4 = *(undefined8 *)a->m_el[0].m_floats;
  uVar5 = *(undefined8 *)a->m_el[1].m_floats;
  uVar6 = *(undefined8 *)a->m_el[2].m_floats;
  fVar15 = (float)uVar6;
  fVar16 = (float)((ulong)uVar6 >> 0x20);
  fVar29 = (float)uVar5;
  fVar30 = (float)((ulong)uVar5 >> 0x20);
  fVar21 = (float)uVar4;
  fVar27 = (float)((ulong)uVar4 >> 0x20);
  fVar19 = (float)uVar2;
  fVar31 = (float)uVar1;
  fVar18 = (float)((ulong)uVar1 >> 0x20);
  fVar17 = (float)uVar3;
  fVar24 = (float)((ulong)uVar3 >> 0x20);
  fVar20 = (float)((ulong)uVar2 >> 0x20);
  fVar14 = fVar15 * fVar17 + fVar21 * fVar31 + fVar29 * fVar19;
  fVar32 = fVar24 * fVar16 + fVar18 * fVar27 + fVar20 * fVar30;
  fVar33 = (fVar16 * fVar17 + fVar27 * fVar31 + fVar30 * fVar19 +
           fVar15 * fVar24 + fVar21 * fVar18 + fVar29 * fVar20) * 0.5;
  fVar15 = (fVar22 * fVar17 + fVar26 * fVar31 + fVar28 * fVar19 +
           fVar13 * fVar15 + fVar25 * fVar21 + fVar23 * fVar29) * 0.5;
  fVar25 = (fVar22 * fVar24 + fVar26 * fVar18 + fVar28 * fVar20 +
           fVar13 * fVar16 + fVar25 * fVar27 + fVar23 * fVar30) * 0.5;
  *(ulong *)h->m_el[0].m_floats = CONCAT44(fVar33,(fVar14 + fVar14) * 0.5);
  h->m_el[0].m_floats[2] = fVar15;
  h->m_el[0].m_floats[3] = 0.0;
  h->m_el[1].m_floats[0] = fVar33;
  h->m_el[1].m_floats[1] = (fVar32 + fVar32) * 0.5;
  h->m_el[1].m_floats[2] = fVar25;
  h->m_el[1].m_floats[3] = 0.0;
  *(ulong *)h->m_el[2].m_floats = CONCAT44(fVar25,fVar15);
  h->m_el[2].m_floats[2] = (fVar8 + fVar8) * 0.5;
  h->m_el[2].m_floats[3] = 0.0;
  return this->m_maxIterations;
}

Assistant:

unsigned int btPolarDecomposition::decompose(const btMatrix3x3& a, btMatrix3x3& u, btMatrix3x3& h) const
{
  // Use the 'u' and 'h' matrices for intermediate calculations
  u = a;
  h = a.inverse();

  for (unsigned int i = 0; i < m_maxIterations; ++i)
  {
    const btScalar h_1 = p1_norm(h);
    const btScalar h_inf = pinf_norm(h);
    const btScalar u_1 = p1_norm(u);
    const btScalar u_inf = pinf_norm(u);

    const btScalar h_norm = h_1 * h_inf;
    const btScalar u_norm = u_1 * u_inf;

    // The matrix is effectively singular so we cannot invert it
    if (btFuzzyZero(h_norm) || btFuzzyZero(u_norm))
      break;

    const btScalar gamma = btPow(h_norm / u_norm, 0.25f);
    const btScalar inv_gamma = btScalar(1.0) / gamma;

    // Determine the delta to 'u'
    const btMatrix3x3 delta = (u * (gamma - btScalar(2.0)) + h.transpose() * inv_gamma) * btScalar(0.5);

    // Update the matrices
    u += delta;
    h = u.inverse();

    // Check for convergence
    if (p1_norm(delta) <= m_tolerance * u_1)
    {
      h = u.transpose() * a;
      h = (h + h.transpose()) * 0.5;
      return i;
    }
  }

  // The algorithm has failed to converge to the specified tolerance, but we
  // want to make sure that the matrices returned are in the right form.
  h = u.transpose() * a;
  h = (h + h.transpose()) * 0.5;

  return m_maxIterations;
}